

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_ls.c
# Opt level: O0

int idaLsDenseDQJac(sunrealtype tt,sunrealtype c_j,N_Vector yy,N_Vector yp,N_Vector rr,SUNMatrix Jac
                   ,IDAMem IDA_mem,N_Vector tmp1)

{
  double dVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  sunindextype sVar5;
  undefined8 uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  sunrealtype *psVar10;
  SUNMatrix in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  long in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  double in_XMM1_Qa;
  int retval;
  IDALsMem idals_mem;
  sunindextype N;
  sunindextype j;
  N_Vector jthCol;
  N_Vector rtemp;
  sunrealtype *cns_data;
  sunrealtype *ewt_data;
  sunrealtype *yp_data;
  sunrealtype *y_data;
  sunrealtype conj;
  sunrealtype srur;
  sunrealtype ypj;
  sunrealtype yj;
  sunrealtype inc_inv;
  sunrealtype inc;
  double local_f0;
  double local_e8;
  double local_d8;
  double local_c8;
  int local_bc;
  long local_a8;
  long local_90;
  double local_48;
  
  local_90 = 0;
  local_bc = 0;
  lVar4 = *(long *)(in_R8 + 0x418);
  sVar5 = SUNDenseMatrix_Columns(in_RCX);
  uVar6 = N_VCloneEmpty(in_R9);
  lVar7 = N_VGetArrayPointer(*(undefined8 *)(in_R8 + 0x180));
  lVar8 = N_VGetArrayPointer(in_RDI);
  lVar9 = N_VGetArrayPointer(in_RSI);
  if (*(int *)(in_R8 + 0x58) != 0) {
    local_90 = N_VGetArrayPointer(*(undefined8 *)(in_R8 + 0x1b8));
  }
  if (0.0 < *(double *)(in_R8 + 8)) {
    local_c8 = sqrt(*(double *)(in_R8 + 8));
  }
  else {
    local_c8 = 0.0;
  }
  for (local_a8 = 0; local_a8 < sVar5; local_a8 = local_a8 + 1) {
    psVar10 = SUNDenseMatrix_Column(in_RCX,local_a8);
    N_VSetArrayPointer(psVar10,uVar6);
    dVar1 = *(double *)(lVar8 + local_a8 * 8);
    dVar2 = *(double *)(lVar9 + local_a8 * 8);
    if (ABS(dVar1) <= ABS(*(double *)(in_R8 + 0x290) * dVar2)) {
      local_d8 = ABS(*(double *)(in_R8 + 0x290) * dVar2);
    }
    else {
      local_d8 = ABS(dVar1);
    }
    if (local_c8 * local_d8 <= 1.0 / *(double *)(lVar7 + local_a8 * 8)) {
      local_f0 = 1.0 / *(double *)(lVar7 + local_a8 * 8);
    }
    else {
      if (ABS(dVar1) <= ABS(*(double *)(in_R8 + 0x290) * dVar2)) {
        local_e8 = ABS(*(double *)(in_R8 + 0x290) * dVar2);
      }
      else {
        local_e8 = ABS(dVar1);
      }
      local_f0 = local_c8 * local_e8;
    }
    local_48 = local_f0;
    if (*(double *)(in_R8 + 0x290) * dVar2 < 0.0) {
      local_48 = -local_f0;
    }
    local_48 = (dVar1 + local_48) - dVar1;
    if (*(int *)(in_R8 + 0x58) != 0) {
      dVar3 = *(double *)(local_90 + local_a8 * 8);
      if ((ABS(dVar3) != 1.0) || (NAN(ABS(dVar3)))) {
        if ((ABS(dVar3) == 2.0) && ((!NAN(ABS(dVar3)) && ((dVar1 + local_48) * dVar3 <= 0.0)))) {
          local_48 = -local_48;
        }
      }
      else if ((dVar1 + local_48) * dVar3 < 0.0) {
        local_48 = -local_48;
      }
    }
    *(double *)(lVar8 + local_a8 * 8) = local_48 + *(double *)(lVar8 + local_a8 * 8);
    *(double *)(lVar9 + local_a8 * 8) = in_XMM1_Qa * local_48 + *(double *)(lVar9 + local_a8 * 8);
    local_bc = (**(code **)(in_R8 + 0x10))
                         (in_XMM0_Qa,in_RDI,in_RSI,in_R9,*(undefined8 *)(in_R8 + 0x18));
    *(long *)(lVar4 + 0xa8) = *(long *)(lVar4 + 0xa8) + 1;
    if (local_bc != 0) break;
    N_VLinearSum(1.0 / local_48,-(1.0 / local_48),in_R9,in_RDX,uVar6);
    *(double *)(lVar8 + local_a8 * 8) = dVar1;
    *(double *)(lVar9 + local_a8 * 8) = dVar2;
  }
  N_VSetArrayPointer(0,uVar6);
  N_VDestroy(uVar6);
  return local_bc;
}

Assistant:

int idaLsDenseDQJac(sunrealtype tt, sunrealtype c_j, N_Vector yy, N_Vector yp,
                    N_Vector rr, SUNMatrix Jac, IDAMem IDA_mem, N_Vector tmp1)
{
  sunrealtype inc, inc_inv, yj, ypj, srur, conj;
  sunrealtype *y_data, *yp_data, *ewt_data, *cns_data = NULL;
  N_Vector rtemp, jthCol;
  sunindextype j, N;
  IDALsMem idals_mem;
  int retval = 0;

  /* access LsMem interface structure */
  idals_mem = (IDALsMem)IDA_mem->ida_lmem;

  /* access matrix dimension */
  N = SUNDenseMatrix_Columns(Jac);

  /* Rename work vectors for readability */
  rtemp = tmp1;

  /* Create an empty vector for matrix column calculations */
  jthCol = N_VCloneEmpty(tmp1);

  /* Obtain pointers to the data for ewt, yy, yp. */
  ewt_data = N_VGetArrayPointer(IDA_mem->ida_ewt);
  y_data   = N_VGetArrayPointer(yy);
  yp_data  = N_VGetArrayPointer(yp);
  if (IDA_mem->ida_constraintsSet)
  {
    cns_data = N_VGetArrayPointer(IDA_mem->ida_constraints);
  }

  srur = SUNRsqrt(IDA_mem->ida_uround);

  for (j = 0; j < N; j++)
  {
    /* Generate the jth col of J(tt,yy,yp) as delta(F)/delta(y_j). */

    /* Set data address of jthCol, and save y_j and yp_j values. */
    N_VSetArrayPointer(SUNDenseMatrix_Column(Jac, j), jthCol);
    yj  = y_data[j];
    ypj = yp_data[j];

    /* Set increment inc to y_j based on sqrt(uround)*abs(y_j), with
    adjustments using yp_j and ewt_j if this is small, and a further
    adjustment to give it the same sign as hh*yp_j. */

    inc = SUNMAX(srur * SUNMAX(SUNRabs(yj), SUNRabs(IDA_mem->ida_hh * ypj)),
                 ONE / ewt_data[j]);

    if (IDA_mem->ida_hh * ypj < ZERO) { inc = -inc; }
    inc = (yj + inc) - yj;

    /* Adjust sign(inc) again if y_j has an inequality constraint. */
    if (IDA_mem->ida_constraintsSet)
    {
      conj = cns_data[j];
      if (SUNRabs(conj) == ONE)
      {
        if ((yj + inc) * conj < ZERO) { inc = -inc; }
      }
      else if (SUNRabs(conj) == TWO)
      {
        if ((yj + inc) * conj <= ZERO) { inc = -inc; }
      }
    }

    /* Increment y_j and yp_j, call res, and break on error return. */
    y_data[j] += inc;
    yp_data[j] += c_j * inc;

    retval = IDA_mem->ida_res(tt, yy, yp, rtemp, IDA_mem->ida_user_data);
    idals_mem->nreDQ++;
    if (retval != 0) { break; }

    /* Construct difference quotient in jthCol */
    inc_inv = ONE / inc;
    N_VLinearSum(inc_inv, rtemp, -inc_inv, rr, jthCol);

    /*  reset y_j, yp_j */
    y_data[j]  = yj;
    yp_data[j] = ypj;
  }

  /* Destroy jthCol vector */
  N_VSetArrayPointer(NULL, jthCol); /* SHOULDN'T BE NEEDED */
  N_VDestroy(jthCol);

  return (retval);
}